

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O1

t_root * __thiscall xemmai::t_root::operator=(t_root *this,t_root *a_value)

{
  t_object *ptVar1;
  t_object *ptVar2;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  long in_FS_OFFSET;
  
  ptVar2 = (a_value->super_t_slot).v_p._M_b._M_p;
  if ((t_object *)0x4 < ptVar2) {
    this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
    *this_00->v_head = ptVar2;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = (this->super_t_slot).v_p._M_b._M_p;
  (this->super_t_slot).v_p._M_b._M_p = ptVar2;
  UNLOCK();
  if ((t_object *)0x4 < ptVar1) {
    this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
    *this_01->v_head = ptVar1;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
    }
    else {
      this_01->v_head = this_01->v_head + 1;
    }
  }
  return this;
}

Assistant:

t_root& operator=(const t_root& a_value)
	{
		static_cast<t_slot&>(*this) = a_value;
		return *this;
	}